

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::RegisterTests
          (ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest> *this)

{
  TestMetaFactoryBase<char> *pTVar1;
  _Alloc_hider test_case_name_00;
  _Alloc_hider name;
  _Alloc_hider value_param;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  *ptr;
  int iVar6;
  iterator param_it;
  Message test_name_stream;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  test_info;
  ParamGenerator<char> generator;
  string test_case_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  for (ptr = (this->tests_).
             super__Vector_base<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      ptr != (this->tests_).
             super__Vector_base<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; ptr = ptr + 1) {
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
    ::linked_ptr(&test_info,ptr);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*__lhs->second)(&generator);
      test_case_name._M_dataplus._M_p = (pointer)&test_case_name.field_2;
      test_case_name._M_string_length = 0;
      test_case_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->first)._M_string_length != 0) {
        std::operator+(&local_70,&__lhs->first,"/");
        std::__cxx11::string::operator=((string *)&test_case_name,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::append((string *)&test_case_name);
      param_it.impl_.ptr_._0_4_ = (*(generator.impl_.value_)->_vptr_ParamGeneratorInterface[2])();
      param_it.impl_.ptr_._4_4_ = extraout_var;
      iVar6 = 0;
      while( true ) {
        iVar3 = (*(generator.impl_.value_)->_vptr_ParamGeneratorInterface[3])();
        local_70._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
        bVar2 = ParamIterator<char>::operator!=(&param_it,(ParamIterator<char> *)&local_70);
        scoped_ptr<testing::internal::ParamIteratorInterface<char>_>::~scoped_ptr
                  ((scoped_ptr<testing::internal::ParamIteratorInterface<char>_> *)&local_70);
        if (!bVar2) break;
        Message::Message(&test_name_stream);
        std::operator<<((ostream *)((long)test_name_stream.ss_.ptr_ + 0x10),
                        (string *)&(test_info.value_)->test_base_name);
        std::operator<<((ostream *)((long)test_name_stream.ss_.ptr_ + 0x10),"/");
        std::ostream::operator<<((void *)((long)test_name_stream.ss_.ptr_ + 0x10),iVar6);
        test_case_name_00 = test_case_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_70,&test_name_stream);
        name._M_p = local_70._M_dataplus._M_p;
        pcVar5 = (char *)(**(code **)(*(long *)param_it.impl_.ptr_ + 0x28))();
        PrintToString<char>(&local_50,pcVar5);
        value_param._M_p = local_50._M_dataplus._M_p;
        iVar3 = (*(this->super_ParameterizedTestCaseInfoBase)._vptr_ParameterizedTestCaseInfoBase[3]
                )(this);
        pTVar1 = ((test_info.value_)->test_meta_factory).ptr_;
        pcVar5 = (char *)(**(code **)(*(long *)param_it.impl_.ptr_ + 0x28))();
        iVar4 = (*pTVar1->_vptr_TestMetaFactoryBase[2])(pTVar1,(ulong)(uint)(int)*pcVar5);
        MakeAndRegisterTestInfo
                  (test_case_name_00._M_p,name._M_p,(char *)0x0,value_param._M_p,
                   (TypeId)CONCAT44(extraout_var_01,iVar3),Test::SetUpTestCase,
                   Test::TearDownTestCase,(TestFactoryBase *)CONCAT44(extraout_var_02,iVar4));
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&test_name_stream.ss_);
        (**(code **)(*(long *)param_it.impl_.ptr_ + 0x18))();
        iVar6 = iVar6 + 1;
      }
      scoped_ptr<testing::internal::ParamIteratorInterface<char>_>::~scoped_ptr(&param_it.impl_);
      std::__cxx11::string::~string((string *)&test_case_name);
      linked_ptr<const_testing::internal::ParamGeneratorInterface<char>_>::~linked_ptr
                (&generator.impl_);
    }
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
    ::~linked_ptr(&test_info);
  }
  return;
}

Assistant:

virtual void RegisterTests() {
    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      linked_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const string& instantiation_name = gen_it->first;
        ParamGenerator<ParamType> generator((*gen_it->second)());

        string test_case_name;
        if ( !instantiation_name.empty() )
          test_case_name = instantiation_name + "/";
        test_case_name += test_info->test_case_base_name;

        int i = 0;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          Message test_name_stream;
          test_name_stream << test_info->test_base_name << "/" << i;
          MakeAndRegisterTestInfo(
              test_case_name.c_str(),
              test_name_stream.GetString().c_str(),
              NULL,  // No type parameter.
              PrintToString(*param_it).c_str(),
              GetTestCaseTypeId(),
              TestCase::SetUpTestCase,
              TestCase::TearDownTestCase,
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it
  }